

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteBlif.c
# Opt level: O2

void Cba_ManWriteBlifLines(FILE *pFile,Cba_Ntk_t *p)

{
  Abc_Nam_t *p_00;
  Cba_ObjType_t CVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int i;
  int iVar5;
  Cba_Ntk_t *p_01;
  char *pcVar6;
  char *pcVar7;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  int iVar8;
  
  iVar5 = 1;
  while (iVar5 < (p->vObjType).nSize) {
    CVar1 = Cba_ObjType(p,iVar5);
    if (CVar1 - CBA_BOX_LAST < 0xffffffa9) {
      iVar5 = iVar5 + 1;
    }
    else {
      iVar2 = Cba_ObjIsBoxUser(p,iVar5);
      if (iVar2 == 0) {
        CVar1 = Cba_ObjType(p,iVar5);
        if (CVar1 == CBA_BOX_GATE) {
          p_00 = p->pDesign->pMods;
          iVar2 = Cba_ObjNtkId(p,iVar5);
          pcVar6 = Abc_NamStr(p_00,iVar2);
          iVar3 = 0;
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate = Mio_LibraryReadGateByName(pLib,pcVar6,(char *)0x0);
          fprintf((FILE *)pFile,".gate %s",pcVar6);
          iVar2 = Cba_ObjFin0(p,iVar5);
          iVar8 = iVar5 + 1;
          while( true ) {
            iVar4 = Cba_ObjFin0(p,iVar8);
            if (iVar4 <= iVar2 + iVar3) break;
            iVar4 = Cba_FinFon(p,iVar2 + iVar3);
            pcVar6 = Mio_GateReadPinName(pGate,iVar3);
            pcVar7 = Cba_FonNameStr(p,iVar4);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar7);
            iVar3 = iVar3 + 1;
          }
          iVar5 = Cba_ObjFon0(p,iVar5);
          while( true ) {
            iVar2 = Cba_ObjFon0(p,iVar8);
            if (iVar2 <= iVar5) break;
            pcVar6 = Mio_GateReadOutName(pGate);
            pcVar7 = Cba_FonNameStr(p,iVar5);
            fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar7);
            iVar5 = iVar5 + 1;
          }
          fputc(10,(FILE *)pFile);
          iVar5 = iVar8;
        }
        else {
          fwrite(".names",6,1,(FILE *)pFile);
          iVar2 = Cba_ObjFin0(p,iVar5);
          while( true ) {
            iVar3 = Cba_ObjFin0(p,iVar5 + 1);
            if (iVar3 <= iVar2) break;
            iVar3 = Cba_FinFon(p,iVar2);
            pcVar6 = Cba_FonNameStr(p,iVar3);
            fprintf((FILE *)pFile," %s",pcVar6);
            iVar2 = iVar2 + 1;
          }
          iVar2 = Cba_ObjFon0(p,iVar5);
          pcVar6 = Cba_FonNameStr(p,iVar2);
          fprintf((FILE *)pFile," %s",pcVar6);
          iVar2 = Cba_ObjFunc(p,iVar5);
          pcVar6 = Abc_NamStr(p->pDesign->pFuns,iVar2);
          fprintf((FILE *)pFile,"\n%s",pcVar6);
          iVar5 = iVar5 + 1;
        }
      }
      else {
        iVar2 = Cba_ObjNtkId(p,iVar5);
        p_01 = Cba_ManNtk(p->pDesign,iVar2);
        fwrite(".subckt",7,1,(FILE *)pFile);
        pcVar6 = Cba_NtkName(p_01);
        iVar8 = 0;
        fprintf((FILE *)pFile," %s",pcVar6);
        iVar2 = Cba_ObjFin0(p,iVar5);
        iVar3 = iVar5 + 1;
        while( true ) {
          iVar4 = Cba_ObjFin0(p,iVar3);
          if (iVar4 <= iVar2 + iVar8) break;
          iVar4 = Cba_FinFon(p,iVar2 + iVar8);
          i = Vec_IntEntry(&p_01->vInputs,iVar8);
          pcVar6 = Cba_ObjNameStr(p_01,i);
          pcVar7 = Cba_FonNameStr(p,iVar4);
          fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar7);
          iVar8 = iVar8 + 1;
        }
        iVar5 = Cba_ObjFon0(p,iVar5);
        iVar2 = 0;
        while( true ) {
          iVar8 = Cba_ObjFon0(p,iVar3);
          if (iVar8 <= iVar5 + iVar2) break;
          iVar8 = Vec_IntEntry(&p_01->vOutputs,iVar2);
          pcVar6 = Cba_ObjNameStr(p_01,iVar8);
          pcVar7 = Cba_FonNameStr(p,iVar5 + iVar2);
          fprintf((FILE *)pFile," %s=%s",pcVar6,pcVar7);
          iVar2 = iVar2 + 1;
        }
        fputc(10,(FILE *)pFile);
        iVar5 = iVar3;
      }
    }
  }
  return;
}

Assistant:

void Cba_ManWriteBlifLines( FILE * pFile, Cba_Ntk_t * p )
{
    int k, iObj, iFin, iFon;
    Cba_NtkForEachBox( p, iObj )
    {
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            Cba_Ntk_t * pNtk = Cba_ObjNtk( p, iObj );
            fprintf( pFile, ".subckt" );
            fprintf( pFile, " %s", Cba_NtkName(pNtk) );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s=%s", Cba_ObjNameStr(pNtk, Cba_NtkPi(pNtk, k)), Cba_FonNameStr(p, iFon) );
            Cba_ObjForEachFon( p, iObj, iFon, k )
                fprintf( pFile, " %s=%s", Cba_ObjNameStr(pNtk, Cba_NtkPo(pNtk, k)), Cba_FonNameStr(p, iFon) );
            fprintf( pFile, "\n" );
        }
        else if ( Cba_ObjIsGate(p, iObj) )
        {
            char * pGateName = Abc_NamStr(p->pDesign->pMods, Cba_ObjNtkId( p, iObj ));
            Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pGateName, NULL );
            fprintf( pFile, ".gate %s", pGateName );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, k), Cba_FonNameStr(p, iFon) );
            Cba_ObjForEachFon( p, iObj, iFon, k )
                fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Cba_FonNameStr(p, iFon) );
            fprintf( pFile, "\n" );
        }
        else
        {
            fprintf( pFile, ".names" );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                fprintf( pFile, " %s", Cba_FonNameStr(p, iFon) );
            fprintf( pFile, " %s", Cba_FonNameStr(p, Cba_ObjFon0(p, iObj)) );
            fprintf( pFile, "\n%s",  Cba_NtkSop(p, Cba_ObjFunc(p, iObj)) );
        }
    }
}